

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void resolveAlias(Parse *pParse,ExprList *pEList,int iCol,Expr *pExpr,int nSubquery)

{
  sqlite3 *db;
  Expr *pEVar1;
  long in_FS_OFFSET;
  Expr temp;
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  Walker local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (pExpr->pAggInfo == (AggInfo *)0x0) {
    pEVar1 = pEList->a[iCol].pExpr;
    db = pParse->db;
    if (pEVar1 == (Expr *)0x0) {
      pEVar1 = (Expr *)0x0;
    }
    else {
      pEVar1 = exprDup(db,pEVar1,0,(EdupBuf *)0x0);
    }
    if (db->mallocFailed == '\0') {
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
      local_a8 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
      local_b8 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
      if (0 < nSubquery) {
        local_68.pParse = (Parse *)0x0;
        local_68.walkerDepth = 0;
        local_68.eCode = 0;
        local_68.mWFlags = 0;
        local_68.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
        local_68.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
        local_68.xExprCallback = incrAggDepth;
        local_68.u._4_4_ = 0;
        local_68.u.n = nSubquery;
        if (pEVar1 != (Expr *)0x0) {
          sqlite3WalkExprNN(&local_68,pEVar1);
        }
      }
      if (pExpr->op == 'r') {
        pEVar1 = sqlite3ExprAddCollateString(pParse,pEVar1,(pExpr->u).zToken);
      }
      memcpy(&local_b8,pEVar1,0x48);
      memcpy(pEVar1,pExpr,0x48);
      memcpy(pExpr,&local_b8,0x48);
      if (((pExpr->flags & 0x1000000) != 0) && ((pExpr->y).pWin != (Window *)0x0)) {
        ((pExpr->y).pWin)->pOwner = pExpr;
      }
      sqlite3ParserAddCleanup(pParse,sqlite3ExprDeleteGeneric,pEVar1);
    }
    else if (pEVar1 != (Expr *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        sqlite3ExprDeleteNN(db,pEVar1);
        return;
      }
      goto LAB_00184156;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_00184156:
  __stack_chk_fail();
}

Assistant:

static void resolveAlias(
  Parse *pParse,         /* Parsing context */
  ExprList *pEList,      /* A result set */
  int iCol,              /* A column in the result set.  0..pEList->nExpr-1 */
  Expr *pExpr,           /* Transform this into an alias to the result set */
  int nSubquery          /* Number of subqueries that the label is moving */
){
  Expr *pOrig;           /* The iCol-th column of the result set */
  Expr *pDup;            /* Copy of pOrig */
  sqlite3 *db;           /* The database connection */

  assert( iCol>=0 && iCol<pEList->nExpr );
  pOrig = pEList->a[iCol].pExpr;
  assert( pOrig!=0 );
  assert( !ExprHasProperty(pExpr, EP_Reduced|EP_TokenOnly) );
  if( pExpr->pAggInfo ) return;
  db = pParse->db;
  pDup = sqlite3ExprDup(db, pOrig, 0);
  if( db->mallocFailed ){
    sqlite3ExprDelete(db, pDup);
    pDup = 0;
  }else{
    Expr temp;
    incrAggFunctionDepth(pDup, nSubquery);
    if( pExpr->op==TK_COLLATE ){
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      pDup = sqlite3ExprAddCollateString(pParse, pDup, pExpr->u.zToken);
    }
    memcpy(&temp, pDup, sizeof(Expr));
    memcpy(pDup, pExpr, sizeof(Expr));
    memcpy(pExpr, &temp, sizeof(Expr));
    if( ExprHasProperty(pExpr, EP_WinFunc) ){
      if( ALWAYS(pExpr->y.pWin!=0) ){
        pExpr->y.pWin->pOwner = pExpr;
      }
    }
    sqlite3ExprDeferredDelete(pParse, pDup);
  }
}